

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::SetAuxSlot
          (DynamicTypeHandler *this,DynamicObject *instance,PropertyId propertyId,bool allowLetConst
          ,int index,Var value)

{
  WriteBarrierPtr<void> *addr;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    bVar2 = ThreadContext::IsOnStack(value);
    if (bVar2) {
      bVar2 = VarIs<Js::RecyclableObject>(value);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0xaf,
                                    "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                    ,
                                    "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                   );
        if (!bVar2) goto LAB_00e4c445;
        *puVar4 = 0;
      }
    }
  }
  if ((int)(this->slotCapacity - (uint)this->inlineSlotCapacity) <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xb0,"(index < GetSlotCapacity() - GetInlineSlotCapacity())",
                                "index < GetSlotCapacity() - GetInlineSlotCapacity()");
    if (!bVar2) goto LAB_00e4c445;
    *puVar4 = 0;
  }
  if (propertyId != -1) {
    iVar3 = (*this->_vptr_DynamicTypeHandler[0x56])
                      (this,instance,(ulong)(uint)propertyId,(ulong)allowLetConst);
    if ((char)iVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0xb1,
                                  "(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst))"
                                  ,
                                  "propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst)"
                                 );
      if (!bVar2) {
LAB_00e4c445:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  addr = (instance->auxSlots).ptr + index;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void DynamicTypeHandler::SetAuxSlot(DynamicObject* instance, int index, Var value)
#endif
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        Assert(index < GetSlotCapacity() - GetInlineSlotCapacity());
        Assert(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst));
        instance->auxSlots[index] = value;
    }